

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::(anonymous_namespace)::
Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
          (_anonymous_namespace_ *this,char *args,
          basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2)

{
  uintptr_t extraout_RAX;
  Status SVar1;
  char *__s;
  undefined1 local_c0 [32];
  AlphaNum local_a0;
  AlphaNum local_70;
  size_t local_40;
  char *local_38;
  
  __s = args_1._M_str;
  local_a0.piece_._M_str = (char *)args_1._M_len;
  local_70.piece_._M_len = 8;
  local_70.piece_._M_str = "Feature ";
  local_a0.piece_._M_len = (size_t)args;
  if (__s == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(__s);
  }
  local_38 = __s;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c0,&local_70,&local_a0);
  absl::lts_20240722::FailedPreconditionError(this,local_c0._8_8_,local_c0._0_8_);
  SVar1.rep_ = (uintptr_t)(local_c0 + 0x10);
  if (local_c0._0_8_ != SVar1.rep_) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    SVar1.rep_ = extraout_RAX;
  }
  return (Status)SVar1.rep_;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}